

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGetTextureSubImageTests.cpp
# Opt level: O2

bool __thiscall gl4cts::GetTextureSubImage::Errors::testTwoDimmensionalTextureErrors(Errors *this)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  GLuint GVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  MessageBuilder *pMVar6;
  char *pcVar7;
  bool bVar8;
  long lVar9;
  undefined1 local_1b0 [384];
  
  iVar4 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  if ((testTwoDimmensionalTextureErrors()::test_textures == '\0') &&
     (iVar5 = __cxa_guard_acquire(&testTwoDimmensionalTextureErrors()::test_textures), iVar5 != 0))
  {
    testTwoDimmensionalTextureErrors::test_textures[0].id = this->m_texture_1D;
    testTwoDimmensionalTextureErrors::test_textures[0].target_name = "GL_TEXTURE_1D";
    testTwoDimmensionalTextureErrors::test_textures[1].id = this->m_texture_1D_array;
    testTwoDimmensionalTextureErrors::test_textures[1].target_name = "GL_TEXTURE_1D_ARRAY";
    testTwoDimmensionalTextureErrors::test_textures[2].id = this->m_texture_2D;
    testTwoDimmensionalTextureErrors::test_textures[2].target_name = "GL_TEXTURE_2D";
    __cxa_guard_release(&testTwoDimmensionalTextureErrors()::test_textures);
  }
  bVar8 = true;
  for (lVar9 = 0; lVar9 != 0x30; lVar9 = lVar9 + 0x10) {
    GVar2 = *(GLuint *)((long)&testTwoDimmensionalTextureErrors::test_textures[0].id + lVar9);
    (*this->m_gl_GetTextureSubImage)
              (GVar2,0,0,0,1,2,(GVar2 != 0xde0) + 1,2,0x1908,0x1401,0x10,this->m_destination_buffer)
    ;
    iVar5 = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
    if (iVar5 != 0x501) {
      local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
      std::operator<<((ostream *)(local_1b0 + 8),
                      "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if the effective target is "
                     );
      pMVar6 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)local_1b0,
                          (char **)((long)&testTwoDimmensionalTextureErrors::test_textures[0].
                                           target_name + lVar9));
      poVar1 = &pMVar6->m_str;
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                      " and either zoffset is not zero, or depth is not one. (OpenGL 4.5 Core Specification chapter 8.11.4). However, the error value "
                     );
      pcVar7 = glu::getErrorName(iVar5);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pcVar7);
      std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," was generated.")
      ;
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
      bVar8 = false;
    }
  }
  if ((testTwoDimmensionalTextureErrors()::test_compressed_textures == '\0') &&
     (iVar5 = __cxa_guard_acquire(&testTwoDimmensionalTextureErrors()::test_compressed_textures),
     iVar5 != 0)) {
    testTwoDimmensionalTextureErrors::test_compressed_textures[0].id = this->m_texture_2D_compressed
    ;
    testTwoDimmensionalTextureErrors::test_compressed_textures[0].target_name = "GL_TEXTURE_2D";
    __cxa_guard_release(&testTwoDimmensionalTextureErrors()::test_compressed_textures);
  }
  this_00 = (ostringstream *)(local_1b0 + 8);
  bVar3 = true;
  while( true ) {
    if (!bVar3) {
      return bVar8;
    }
    (*this->m_gl_GetCompressedTextureSubImage)
              (testTwoDimmensionalTextureErrors::test_compressed_textures[0].id,0,0,0,1,4,4,2,0x10,
               this->m_destination_buffer);
    iVar5 = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
    if (iVar5 == 0x501) break;
    local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,
                    "GL_INVALID_VALUE error is expected to be generated by glGetCompressedTextureSubImage if the effective target is "
                   );
    pMVar6 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,
                        &testTwoDimmensionalTextureErrors::test_compressed_textures[0].target_name);
    poVar1 = &pMVar6->m_str;
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                    " and either zoffset is not zero, or depth is not one. (OpenGL 4.5 Core Specification chapter 8.11.4). However, the error value "
                   );
    pcVar7 = glu::getErrorName(iVar5);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,pcVar7);
    std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>," was generated.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    bVar3 = false;
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool gl4cts::GetTextureSubImage::Errors::testTwoDimmensionalTextureErrors()
{
	/* OpenGL functions access point. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test. */
	static const struct
	{
		glw::GLuint		   id;
		const glw::GLchar* target_name;
	} test_textures[] = { { m_texture_1D, "GL_TEXTURE_1D" },
						  { m_texture_1D_array, "GL_TEXTURE_1D_ARRAY" },
						  { m_texture_2D, "GL_TEXTURE_2D" } };

	static const glw::GLuint test_textures_size = sizeof(test_textures) / sizeof(test_textures[0]);

	glw::GLint is_error = true;

	for (glw::GLuint i = 0; i < test_textures_size; ++i)
	{
		m_gl_GetTextureSubImage(test_textures[i].id, 0, 0, 0, 1, s_texture_data_width,
								(test_textures[i].id == GL_TEXTURE_1D) ? 1 : s_texture_data_height, 2, GL_RGBA,
								GL_UNSIGNED_BYTE, s_destination_buffer_size, m_destination_buffer);

		glw::GLint error_value	 = gl.getError();
		glw::GLint is_proper_error = (GL_INVALID_VALUE == error_value);

		if (!is_proper_error)
		{
			is_error = false;

			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "GL_INVALID_VALUE error is expected to be generated by glGetTextureSubImage if the effective"
				   " target is "
				<< test_textures[i].target_name << " and either zoffset is not zero, or depth"
												   " is not one. (OpenGL 4.5 Core Specification chapter 8.11.4)."
												   " However, the error value "
				<< glu::getErrorName(error_value) << " was generated." << tcu::TestLog::EndMessage;
		}
	}

	/* Test (compressed textures). */
	static const struct
	{
		glw::GLuint		   id;
		const glw::GLchar* target_name;
	} test_compressed_textures[] = { { m_texture_2D_compressed, "GL_TEXTURE_2D" } };

	static const glw::GLuint test_compressed_textures_size =
		sizeof(test_compressed_textures) / sizeof(test_compressed_textures[0]);

	for (glw::GLuint i = 0; i < test_compressed_textures_size; ++i)
	{
		m_gl_GetCompressedTextureSubImage(test_compressed_textures[i].id, 0, 0, 0, 1, s_texture_data_compressed_width,
										  s_texture_data_compressed_height, 2, s_destination_buffer_size,
										  m_destination_buffer);

		glw::GLint error_value = gl.getError();

		glw::GLint is_proper_error_compressed = (GL_INVALID_VALUE == error_value);

		if (!is_proper_error_compressed)
		{
			is_error = false;

			m_testCtx.getLog() << tcu::TestLog::Message << "GL_INVALID_VALUE error is expected to be generated by "
														   "glGetCompressedTextureSubImage if the effective"
														   " target is "
							   << test_compressed_textures[i].target_name
							   << " and either zoffset is not zero, or depth"
								  " is not one. (OpenGL 4.5 Core Specification chapter 8.11.4)."
								  " However, the error value "
							   << glu::getErrorName(error_value) << " was generated." << tcu::TestLog::EndMessage;
		}
	}

	if (is_error)
	{
		return true;
	}

	return false;
}